

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

TestVat * __thiscall capnp::_::anon_unknown_0::TestNetwork::add(TestNetwork *this,StringPtr name)

{
  HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_> *pHVar1
  ;
  Array<kj::_::HashBucket> *pAVar2;
  size_t *psVar3;
  uint uVar4;
  HashBucket *pHVar5;
  size_t sVar6;
  ArrayDisposer *pAVar7;
  Entry *pEVar8;
  RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
  *pRVar9;
  TestVat *pTVar10;
  TestNetwork *pTVar11;
  uint uVar12;
  int iVar13;
  TestVat *pTVar14;
  Iface *pIVar15;
  long lVar16;
  HashBucket *pHVar17;
  RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
  *pRVar18;
  TestVat *ptrCopy;
  size_t __n;
  Entry *pEVar19;
  size_t in_R8;
  RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
  *pRVar20;
  ulong capacity;
  HashBucket *_s944;
  long lVar21;
  HashBucket *pHVar22;
  uint uVar23;
  size_t sVar24;
  ArrayPtr<const_unsigned_char> s;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  Array<kj::_::HashBucket> local_60;
  undefined8 *local_48;
  long local_40;
  TestNetwork *local_38;
  
  __n = name.content.size_;
  s.ptr = (uchar *)name.content.ptr;
  pTVar14 = (TestVat *)operator_new(0x290);
  (pTVar14->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase =
       (_func_int **)&PTR_baseConnect_006b9e18;
  pTVar14->network = this;
  (pTVar14->self).content.ptr = (char *)s.ptr;
  (pTVar14->self).content.size_ = __n;
  (pTVar14->connections).table.rows.builder.ptr = (Entry *)0x0;
  (pTVar14->connections).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>::Entry>
        *)0x0;
  (pTVar14->connections).table.rows.builder.endPtr = (Entry *)0x0;
  pTVar14->sent = 0;
  pTVar14->received = 0;
  (pTVar14->shutdownExceptionToThrow).ptr.isSet = false;
  (pTVar14->connections).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (pTVar14->connections).table.indexes.erasedCount = 0;
  (pTVar14->connections).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pTVar14->connections).table.indexes.buckets.size_ = 0;
  (pTVar14->connections).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (pTVar14->acceptQueue).values.
  super__List_base<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pTVar14->acceptQueue;
  (pTVar14->acceptQueue).values.
  super__List_base<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pTVar14->acceptQueue;
  (pTVar14->acceptQueue).values.
  super__List_base<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>_>
  ._M_impl._M_node._M_size = 0;
  (pTVar14->acceptQueue).waiters.queue.head.ptr = (BaseNode *)0x0;
  (pTVar14->acceptQueue).waiters.queue.tail =
       (Maybe<kj::WaiterQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>::BaseNode_&>
        *)&(pTVar14->acceptQueue).waiters;
  (pTVar14->acceptQueue).waiters.queue.listSize = 0;
  pIVar15 = (Iface *)operator_new(0x10);
  pIVar15->_vptr_Iface = (_func_int **)&PTR_operator___006b9e60;
  (pTVar14->sendCallback).impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<bool(capnp::MessageBuilder&)>::Impl<capnp::_::(anonymous_namespace)::TestVat::sendCallback::{lambda(capnp::MessageBuilder&)#1}>>
        ::instance;
  (pTVar14->sendCallback).impl.ptr = pIVar15;
  (pTVar14->tphExchanges).table.rows.builder.ptr = (Entry *)0x0;
  (pTVar14->tphExchanges).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
        *)0x0;
  (pTVar14->tphExchanges).table.rows.builder.endPtr = (Entry *)0x0;
  (pTVar14->tphExchanges).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (pTVar14->tphExchanges).table.indexes.erasedCount = 0;
  (pTVar14->tphExchanges).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pTVar14->tphExchanges).table.indexes.buckets.size_ = 0;
  (pTVar14->tphExchanges).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  pEVar19 = (this->map).table.rows.builder.ptr;
  lVar21 = (long)(this->map).table.rows.builder.pos - (long)pEVar19;
  lVar16 = lVar21 >> 5;
  pHVar5 = (HashBucket *)(this->map).table.indexes.buckets.size_;
  if ((ulong)((long)pHVar5 * 2) < ((this->map).table.indexes.erasedCount + lVar16) * 3 + 3) {
    pAVar2 = &(this->map).table.indexes.buckets;
    oldBuckets.size_ = lVar16 * 3 + 3;
    oldBuckets.ptr = pHVar5;
    kj::_::rehash(&local_60,(_ *)pAVar2->ptr,oldBuckets,in_R8);
    pHVar5 = pAVar2->ptr;
    if (pHVar5 != (HashBucket *)0x0) {
      sVar6 = (this->map).table.indexes.buckets.size_;
      pAVar2->ptr = (HashBucket *)0x0;
      (this->map).table.indexes.buckets.size_ = 0;
      pAVar7 = (this->map).table.indexes.buckets.disposer;
      (**pAVar7->_vptr_ArrayDisposer)(pAVar7,pHVar5,8,sVar6,sVar6,0);
    }
    (this->map).table.indexes.buckets.ptr = local_60.ptr;
    (this->map).table.indexes.buckets.size_ = local_60.size_;
    (this->map).table.indexes.buckets.disposer = local_60.disposer;
    (this->map).table.indexes.erasedCount = 0;
  }
  s.size_ = __n - 1;
  uVar12 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
  pHVar1 = &this->map;
  pHVar5 = (this->map).table.indexes.buckets.ptr;
  sVar6 = (this->map).table.indexes.buckets.size_;
  uVar23 = (int)sVar6 - 1U & uVar12;
  pHVar22 = (HashBucket *)0x0;
  local_40 = lVar21;
  local_38 = this;
  do {
    pTVar11 = local_38;
    pHVar17 = pHVar5 + uVar23;
    uVar4 = pHVar17->value;
    if (uVar4 == 1) {
      if (pHVar22 == (HashBucket *)0x0) {
        pHVar22 = pHVar17;
      }
    }
    else {
      if (uVar4 == 0) {
        if (pHVar22 != (HashBucket *)0x0) {
          psVar3 = &(local_38->map).table.indexes.erasedCount;
          *psVar3 = *psVar3 - 1;
          pHVar17 = pHVar22;
        }
        *pHVar17 = (HashBucket)((ulong)uVar12 + local_40 * 0x8000000 + 0x200000000);
        pRVar20 = (local_38->map).table.rows.builder.pos;
        if (pRVar20 == (local_38->map).table.rows.builder.endPtr) {
          pEVar19 = (pHVar1->table).rows.builder.ptr;
          capacity = 4;
          if ((long)pRVar20 - (long)pEVar19 != 0) {
            capacity = (long)pRVar20 - (long)pEVar19 >> 4;
          }
          if (capacity < (ulong)((long)pRVar20 - (long)pEVar19 >> 5)) {
            while (pRVar18 = pRVar20, pEVar19 + capacity < pRVar18) {
              (pTVar11->map).table.rows.builder.pos = pRVar18 + -1;
              pRVar20 = pRVar18 + -1;
              if (pRVar18[-1].value.ptr != (TestVat *)0x0) {
                pRVar18[-1].value.ptr = (TestVat *)0x0;
                (**(pRVar18[-1].value.disposer)->_vptr_Disposer)();
                pRVar20 = (pTVar11->map).table.rows.builder.pos;
              }
            }
          }
          pRVar18 = (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
                     *)kj::_::HeapArrayDisposer::allocateImpl
                                 (0x20,0,capacity,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
          local_48 = &kj::_::HeapArrayDisposer::instance;
          pEVar19 = (pTVar11->map).table.rows.builder.ptr;
          pEVar8 = (pTVar11->map).table.rows.builder.pos;
          pRVar20 = pRVar18;
          if (pEVar19 != pEVar8) {
            do {
              sVar6 = (pEVar19->key).content.size_;
              (pRVar20->key).content.ptr = (pEVar19->key).content.ptr;
              (pRVar20->key).content.size_ = sVar6;
              pTVar10 = (pEVar19->value).ptr;
              (pRVar20->value).disposer = (pEVar19->value).disposer;
              (pRVar20->value).ptr = pTVar10;
              (pEVar19->value).ptr = (TestVat *)0x0;
              pRVar20 = pRVar20 + 1;
              pEVar19 = pEVar19 + 1;
            } while (pEVar19 != pEVar8);
            pEVar19 = (pHVar1->table).rows.builder.ptr;
          }
          if (pEVar19 != (Entry *)0x0) {
            pRVar9 = (pTVar11->map).table.rows.builder.pos;
            pEVar8 = (pTVar11->map).table.rows.builder.endPtr;
            (pHVar1->table).rows.builder.ptr = (Entry *)0x0;
            (this->map).table.rows.builder.pos =
                 (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
                  *)0x0;
            (this->map).table.rows.builder.endPtr = (Entry *)0x0;
            pAVar7 = (pTVar11->map).table.rows.builder.disposer;
            local_60.ptr = (HashBucket *)pRVar18;
            local_60.size_ = (size_t)pRVar20;
            local_60.disposer = (ArrayDisposer *)(pRVar18 + capacity);
            (**pAVar7->_vptr_ArrayDisposer)
                      (pAVar7,pEVar19,0x20,(long)pRVar9 - (long)pEVar19 >> 5,
                       (long)pEVar8 - (long)pEVar19 >> 5,
                       kj::ArrayDisposer::
                       Dispose_<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>::Entry>
                       ::destruct);
          }
          (pTVar11->map).table.rows.builder.ptr = pRVar18;
          (pTVar11->map).table.rows.builder.pos = pRVar20;
          (pTVar11->map).table.rows.builder.endPtr = pRVar18 + capacity;
          (pTVar11->map).table.rows.builder.disposer =
               (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        }
        (pRVar20->key).content.ptr = (char *)s.ptr;
        (pRVar20->key).content.size_ = __n;
        (pRVar20->value).disposer =
             (Disposer *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestVat>::instance;
        (pRVar20->value).ptr = pTVar14;
        pRVar20 = (pTVar11->map).table.rows.builder.pos;
        (pTVar11->map).table.rows.builder.pos = pRVar20 + 1;
        return (pRVar20->value).ptr;
      }
      if (((pHVar17->hash == uVar12) && (pEVar19[uVar4 - 2].key.content.size_ == __n)) &&
         ((__n == 0 || (iVar13 = bcmp(pEVar19[uVar4 - 2].key.content.ptr,s.ptr,__n), iVar13 == 0))))
      {
        kj::_::throwDuplicateTableRow();
      }
    }
    sVar24 = (ulong)uVar23 + 1;
    uVar23 = (uint)sVar24;
    if (sVar24 == sVar6) {
      uVar23 = 0;
    }
  } while( true );
}

Assistant:

TestVat& TestNetwork::add(kj::StringPtr name) {
  return *map.insert(name, kj::heap<TestVat>(*this, name)).value;
}